

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radix_sort.cpp
# Opt level: O3

void __thiscall duckdb::LocalSortState::SortInMemory(LocalSortState *this)

{
  BufferManager *buffer_manager;
  uchar *puVar1;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_duckdb[P]duckdb_src_common_sort_radix_sort_cpp:32:12)>
  __comp;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_duckdb[P]duckdb_src_common_sort_radix_sort_cpp:32:12)>
  __comp_00;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_duckdb[P]duckdb_src_common_sort_radix_sort_cpp:32:12)>
  __comp_01;
  bool bVar2;
  const_reference cVar3;
  int iVar4;
  int iVar5;
  reference this_00;
  reference pvVar6;
  type pRVar7;
  free_function_ptr_t p_Var8;
  const_reference pvVar9;
  const_reference pvVar10;
  _Head_base<0UL,_duckdb::PrivateAllocatorData_*,_false> __s;
  long lVar11;
  pointer pSVar12;
  uchar **ppuVar13;
  const_reference pvVar14;
  const_iterator cVar15;
  undefined4 extraout_var;
  data_ptr_t pointer;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  byte bVar21;
  size_t size;
  uchar **__i;
  long lVar22;
  SortLayout *pSVar23;
  idx_t iVar24;
  ulong uVar25;
  ulong uVar26;
  idx_t *count;
  int *dest;
  allocate_function_ptr_t l_ptr;
  allocate_function_ptr_t r_ptr;
  uchar **ppuVar27;
  idx_t iVar28;
  bool bVar29;
  idx_t sorting_size;
  int order;
  idx_t col_offset;
  data_ptr_t dataptr;
  idx_t row_width;
  value_type logical_type;
  data_ptr_t blob_row_ptr;
  BufferHandle handle;
  _Head_base<0UL,_duckdb::PrivateAllocatorData_*,_false> local_190;
  idx_t local_188;
  uchar **local_180;
  ulong local_178;
  idx_t local_170;
  int local_164;
  ulong local_160;
  SortLayout *local_158;
  idx_t local_150;
  free_function_ptr_t local_148;
  idx_t local_140;
  Allocator local_138;
  AllocatedData local_118;
  const_reference pvStack_100;
  idx_t *local_f8;
  LogicalType *pLStack_f0;
  type local_e8;
  LocalSortState *local_e0;
  BufferManager *local_d8;
  ulong local_d0;
  ulong local_c8;
  ulong local_c0;
  uchar **local_b8;
  LogicalType local_b0;
  RowLayout *local_98;
  vector<unsigned_long,_true> *local_90;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_88;
  vector<duckdb::OrderType,_true> *local_80;
  allocate_function_ptr_t local_78;
  long local_70;
  allocate_function_ptr_t local_68;
  BufferHandle local_60;
  BufferHandle local_48;
  
  this_00 = vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_true>
            ::back(&this->sorted_blocks);
  local_e8 = unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>::
             operator*(this_00);
  pvVar6 = vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
           ::back(&local_e8->radix_sorting_data);
  pRVar7 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>::
           operator*(pvVar6);
  (*this->buffer_manager->_vptr_BufferManager[7])(&local_60,this->buffer_manager,pRVar7);
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&local_60.node);
  count = &pRVar7->count;
  local_148 = (free_function_ptr_t)(local_60.node.ptr)->buffer;
  pSVar23 = this->sort_layout;
  if (*count != 0) {
    p_Var8 = local_148 + pSVar23->comparison_size;
    uVar26 = 0;
    do {
      *(int *)p_Var8 = (int)uVar26;
      pSVar23 = this->sort_layout;
      p_Var8 = p_Var8 + pSVar23->entry_size;
      uVar26 = (ulong)((int)uVar26 + 1);
    } while (uVar26 < *count);
  }
  local_170 = 0;
  local_150 = 0;
  local_188 = 0;
  if (pSVar23->column_count != 0) {
    local_e8 = (type)&local_e8->blob_sorting_data;
    bVar29 = false;
    __s._M_head_impl = (PrivateAllocatorData *)0x0;
    local_190._M_head_impl = (PrivateAllocatorData *)0x0;
    local_138.reallocate_function = (reallocate_function_ptr_t)count;
    local_e0 = this;
    do {
      pvVar9 = vector<unsigned_long,_true>::operator[](&pSVar23->column_sizes,local_188);
      local_170 = local_170 + *pvVar9;
      bVar2 = !bVar29;
      bVar29 = true;
      if (bVar2) {
        pvVar10 = vector<duckdb::LogicalType,_true>::operator[]
                            (&this->sort_layout->logical_types,local_188);
        bVar29 = pvVar10->physical_type_ == VARCHAR;
      }
      cVar3 = vector<bool,_true>::get<true>(&this->sort_layout->constant_size,local_188);
      p_Var8 = local_148;
      if ((!cVar3) || (pSVar23 = this->sort_layout, pSVar23->column_count - 1 <= local_188)) {
        buffer_manager = this->buffer_manager;
        if (__s._M_head_impl == (PrivateAllocatorData *)0x0) {
          RadixSort(buffer_manager,(data_ptr_t *)&local_148,count,&local_150,&local_170,
                    this->sort_layout,bVar29);
          uVar26 = *count;
          __s._M_head_impl = (PrivateAllocatorData *)operator_new__(uVar26);
          if (local_190._M_head_impl != (PrivateAllocatorData *)0x0) {
            operator_delete__(local_190._M_head_impl);
            uVar26 = *count;
          }
          if (uVar26 - 1 != 0) {
            switchD_012e3010::default(__s._M_head_impl,1,uVar26 - 1);
          }
          *(undefined1 *)((long)__s._M_head_impl + (uVar26 - 1)) = 0;
          local_190._M_head_impl = __s._M_head_impl;
        }
        else {
          iVar28 = *count;
          if (iVar28 != 0) {
            pSVar23 = this->sort_layout;
            uVar26 = 0;
            do {
              if (*(char *)((long)&(__s._M_head_impl)->_vptr_PrivateAllocatorData + uVar26) ==
                  '\x01') {
                uVar16 = uVar26 + 1;
                if (uVar26 + 1 < iVar28) {
                  uVar16 = iVar28;
                }
                uVar20 = uVar26;
                do {
                  uVar18 = uVar16 - 1;
                  uVar25 = uVar16;
                  if (uVar16 - 1 == uVar20) break;
                  uVar25 = uVar20 + 1;
                  lVar11 = uVar20 + 1;
                  uVar18 = uVar20;
                  uVar20 = uVar25;
                } while (*(char *)((long)&(__s._M_head_impl)->_vptr_PrivateAllocatorData + lVar11)
                         != '\0');
                local_118.allocator.ptr = (Allocator *)(p_Var8 + uVar26 * pSVar23->entry_size);
                local_b0._0_8_ = (uVar18 - uVar26) + 2;
                RadixSort(buffer_manager,(data_ptr_t *)&local_118,(idx_t *)&local_b0,&local_150,
                          &local_170,pSVar23,bVar29);
                iVar28 = *(idx_t *)local_138.reallocate_function;
                uVar26 = uVar25;
              }
              uVar26 = uVar26 + 1;
              this = local_e0;
              count = (idx_t *)local_138.reallocate_function;
            } while (uVar26 < iVar28);
          }
        }
        cVar3 = vector<bool,_true>::get<true>(&this->sort_layout->constant_size,local_188);
        if (((cVar3) && (local_188 == this->sort_layout->column_count - 1)) ||
           (iVar28 = *count, iVar28 == 1)) break;
        pSVar23 = this->sort_layout;
        p_Var8 = local_148 + local_150;
        iVar24 = pSVar23->entry_size;
        uVar26 = 0;
        local_138.private_data.
        super_unique_ptr<duckdb::PrivateAllocatorData,_std::default_delete<duckdb::PrivateAllocatorData>_>
        ._M_t.
        super___uniq_ptr_impl<duckdb::PrivateAllocatorData,_std::default_delete<duckdb::PrivateAllocatorData>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::PrivateAllocatorData_*,_std::default_delete<duckdb::PrivateAllocatorData>_>
        .super__Head_base<0UL,_duckdb::PrivateAllocatorData_*,_false>._M_head_impl =
             (unique_ptr<duckdb::PrivateAllocatorData,_std::default_delete<duckdb::PrivateAllocatorData>_>
              )(unique_ptr<duckdb::PrivateAllocatorData,_std::default_delete<duckdb::PrivateAllocatorData>_>
                )__s._M_head_impl;
        do {
          if (*(char *)((long)local_138.private_data.
                              super_unique_ptr<duckdb::PrivateAllocatorData,_std::default_delete<duckdb::PrivateAllocatorData>_>
                              ._M_t.
                              super___uniq_ptr_impl<duckdb::PrivateAllocatorData,_std::default_delete<duckdb::PrivateAllocatorData>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_duckdb::PrivateAllocatorData_*,_std::default_delete<duckdb::PrivateAllocatorData>_>
                              .super__Head_base<0UL,_duckdb::PrivateAllocatorData_*,_false>.
                              _M_head_impl + uVar26) == '\x01') {
            iVar4 = FastMemcmp(p_Var8,p_Var8 + iVar24,local_170);
            bVar29 = iVar4 == 0;
            iVar24 = pSVar23->entry_size;
            iVar28 = *count;
          }
          else {
            bVar29 = false;
          }
          __s._M_head_impl = (PrivateAllocatorData *)local_138.private_data;
          *(bool *)((long)(_func_int ***)
                          local_138.private_data.
                          super_unique_ptr<duckdb::PrivateAllocatorData,_std::default_delete<duckdb::PrivateAllocatorData>_>
                          ._M_t.
                          super___uniq_ptr_impl<duckdb::PrivateAllocatorData,_std::default_delete<duckdb::PrivateAllocatorData>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_duckdb::PrivateAllocatorData_*,_std::default_delete<duckdb::PrivateAllocatorData>_>
                          .super__Head_base<0UL,_duckdb::PrivateAllocatorData_*,_false>._M_head_impl
                   + uVar26) = bVar29;
          p_Var8 = p_Var8 + iVar24;
          uVar26 = uVar26 + 1;
        } while (uVar26 < iVar28 - 1);
        lVar11 = *count - 1;
        if (*count == 1) break;
        lVar19 = 0;
        bVar21 = 0;
        do {
          while ((bVar21 & 1) == 0) {
            bVar21 = *(byte *)((long)(_func_int ***)
                                     local_138.private_data.
                                     super_unique_ptr<duckdb::PrivateAllocatorData,_std::default_delete<duckdb::PrivateAllocatorData>_>
                                     ._M_t.
                                     super___uniq_ptr_impl<duckdb::PrivateAllocatorData,_std::default_delete<duckdb::PrivateAllocatorData>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_duckdb::PrivateAllocatorData_*,_std::default_delete<duckdb::PrivateAllocatorData>_>
                                     .super__Head_base<0UL,_duckdb::PrivateAllocatorData_*,_false>.
                                     _M_head_impl + lVar19);
            lVar19 = lVar19 + 1;
            if (lVar19 == lVar11) {
              if (bVar21 == 0) goto LAB_012b5790;
              goto LAB_012b50fc;
            }
          }
          lVar19 = lVar19 + 1;
          bVar21 = 1;
        } while (lVar19 != lVar11);
LAB_012b50fc:
        cVar3 = vector<bool,_true>::get<true>(&this->sort_layout->constant_size,local_188);
        if (!cVar3) {
          local_d8 = this->buffer_manager;
          pSVar23 = this->sort_layout;
          local_138.free_function = local_148;
          pSVar12 = unique_ptr<duckdb::SortedData,_std::default_delete<duckdb::SortedData>,_true>::
                    operator->((unique_ptr<duckdb::SortedData,_std::default_delete<duckdb::SortedData>,_true>
                                *)local_e8);
          pvVar6 = vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
                   ::back(&pSVar12->data_blocks);
          pRVar7 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>
                   ::operator*(pvVar6);
          (*local_d8->_vptr_BufferManager[7])(&local_48,local_d8,pRVar7);
          optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&local_48.node);
          iVar28 = *count;
          if (iVar28 != 0) {
            local_78 = (allocate_function_ptr_t)(local_48.node.ptr)->buffer;
            local_98 = &pSVar23->blob_layout;
            local_80 = &pSVar23->order_types;
            local_88 = &(pSVar23->sorting_to_blob_col)._M_h;
            local_90 = &(pSVar23->blob_layout).offsets;
            uVar26 = 0;
            local_158 = pSVar23;
            do {
              if (*(char *)((long)&(__s._M_head_impl)->_vptr_PrivateAllocatorData + uVar26) ==
                  '\x01') {
                uVar16 = uVar26 + 1;
                if (uVar26 + 1 < iVar28) {
                  uVar16 = iVar28;
                }
                local_70 = (long)&(__s._M_head_impl)->_vptr_PrivateAllocatorData + uVar26;
                local_c0 = uVar26;
                do {
                  uVar20 = local_c0;
                  local_160 = uVar16 - 1;
                  local_c0 = uVar16;
                  if (uVar16 - 1 == uVar20) break;
                  local_c0 = uVar20 + 1;
                  local_160 = uVar20;
                } while (*(char *)((long)&(__s._M_head_impl)->_vptr_PrivateAllocatorData +
                                  uVar20 + 1) != '\0');
                local_138.allocate_function = local_78;
                local_140 = (pSVar23->blob_layout).row_width;
                p_Var8 = local_138.free_function + pSVar23->entry_size * uVar26;
                local_68 = local_78 + *(uint *)(p_Var8 + pSVar23->comparison_size) * local_140;
                local_178 = uVar26;
                bVar29 = Comparators::TieIsBreakable(&local_188,(data_ptr_t *)&local_68,pSVar23);
                if (bVar29) {
                  uVar26 = local_160 + 2;
                  uVar20 = uVar26 - local_178;
                  uVar16 = uVar20 * 8;
                  local_d0 = uVar20;
                  ppuVar13 = (uchar **)operator_new__(-(ulong)(uVar20 >> 0x3d != 0) | uVar16);
                  if (local_178 < uVar26) {
                    iVar28 = pSVar23->entry_size;
                    lVar11 = 0;
                    do {
                      ppuVar13[lVar11] = (uchar *)p_Var8;
                      p_Var8 = p_Var8 + iVar28;
                      lVar11 = lVar11 + 1;
                    } while ((local_160 - local_178) + 2 != lVar11);
                  }
                  pvVar14 = vector<duckdb::OrderType,_true>::operator[](local_80,local_188);
                  local_164 = ((*pvVar14 != DESCENDING) - 1) + (uint)(*pvVar14 != DESCENDING);
                  cVar15 = ::std::
                           _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                           ::find(local_88,&local_188);
                  local_180 = ppuVar13;
                  local_c8 = uVar26;
                  if (cVar15.
                      super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>
                      ._M_cur == (__node_type *)0x0) {
                    ::std::__throw_out_of_range("_Map_base::at");
                  }
                  pvVar9 = vector<unsigned_long,_true>::operator[]
                                     (local_90,*(size_type *)
                                                ((long)cVar15.
                                                  super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>
                                                  ._M_cur + 0x10));
                  pvVar10 = vector<duckdb::LogicalType,_true>::operator[]
                                      (&local_98->types,
                                       *(size_type *)
                                        ((long)cVar15.
                                               super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>
                                               ._M_cur + 0x10));
                  LogicalType::LogicalType(&local_b0,pvVar10);
                  local_118.allocator.ptr = &local_138;
                  local_118.pointer = (data_ptr_t)&local_164;
                  local_f8 = &local_140;
                  local_118.allocated_size = (idx_t)pSVar23;
                  pvStack_100 = pvVar9;
                  pLStack_f0 = &local_b0;
                  if (uVar16 != 0) {
                    local_b8 = local_180 + uVar20;
                    lVar11 = 0x3f;
                    if ((long)uVar16 >> 3 != 0) {
                      for (; (ulong)((long)uVar16 >> 3) >> lVar11 == 0; lVar11 = lVar11 + -1) {
                      }
                    }
                    __comp._M_comp.order = (int *)local_118.pointer;
                    __comp._M_comp.blob_ptr = (data_ptr_t *)local_118.allocator.ptr;
                    __comp._M_comp.sort_layout = pSVar23;
                    __comp._M_comp.tie_col_offset = pvVar9;
                    __comp._M_comp.row_width = local_f8;
                    __comp._M_comp.logical_type = &local_b0;
                    ::std::
                    __introsort_loop<unsigned_char**,long,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::SortTiedBlobs(duckdb::BufferManager&,unsigned_char*,unsigned_long_const&,unsigned_long_const&,unsigned_long_const&,bool*,unsigned_char*,duckdb::SortLayout_const&)::__0>>
                              (local_180,local_b8,(ulong)(((uint)lVar11 ^ 0x3f) * 2) ^ 0x7e,__comp);
                    if ((long)uVar16 < 0x81) {
                      __comp_01._M_comp.order = (int *)local_118.pointer;
                      __comp_01._M_comp.blob_ptr = (data_ptr_t *)local_118.allocator.ptr;
                      __comp_01._M_comp.sort_layout = (SortLayout *)local_118.allocated_size;
                      __comp_01._M_comp.tie_col_offset = pvStack_100;
                      __comp_01._M_comp.row_width = local_f8;
                      __comp_01._M_comp.logical_type = pLStack_f0;
                      ::std::
                      __insertion_sort<unsigned_char**,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::SortTiedBlobs(duckdb::BufferManager&,unsigned_char*,unsigned_long_const&,unsigned_long_const&,unsigned_long_const&,bool*,unsigned_char*,duckdb::SortLayout_const&)::__0>>
                                (local_180,local_b8,__comp_01);
                    }
                    else {
                      ppuVar13 = local_180 + 0x10;
                      __comp_00._M_comp.order = (int *)local_118.pointer;
                      __comp_00._M_comp.blob_ptr = (data_ptr_t *)local_118.allocator.ptr;
                      __comp_00._M_comp.sort_layout = (SortLayout *)local_118.allocated_size;
                      __comp_00._M_comp.tie_col_offset = pvStack_100;
                      __comp_00._M_comp.row_width = local_f8;
                      __comp_00._M_comp.logical_type = pLStack_f0;
                      ::std::
                      __insertion_sort<unsigned_char**,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::SortTiedBlobs(duckdb::BufferManager&,unsigned_char*,unsigned_long_const&,unsigned_long_const&,unsigned_long_const&,bool*,unsigned_char*,duckdb::SortLayout_const&)::__0>>
                                (local_180,ppuVar13,__comp_00);
                      do {
                        puVar1 = *ppuVar13;
                        ppuVar27 = ppuVar13;
                        while (iVar4 = local_164,
                              iVar5 = Comparators::CompareVal
                                                ((data_ptr_t)
                                                 (local_138.allocate_function +
                                                 *(uint *)(puVar1 + pSVar23->comparison_size) *
                                                 local_140 + *pvVar9),
                                                 (data_ptr_t)
                                                 (local_138.allocate_function +
                                                 *(uint *)(ppuVar27[-1] + pSVar23->comparison_size)
                                                 * local_140 + *pvVar9),&local_b0),
                              iVar5 * iVar4 < 0) {
                          *ppuVar27 = ppuVar27[-1];
                          ppuVar27 = ppuVar27 + -1;
                        }
                        *ppuVar27 = puVar1;
                        ppuVar13 = ppuVar13 + 1;
                      } while (ppuVar13 != local_b8);
                    }
                  }
                  iVar4 = (*local_d8->_vptr_BufferManager[0x14])();
                  uVar26 = local_d0;
                  iVar28 = pSVar23->entry_size * local_d0;
                  pointer = Allocator::AllocateData
                                      ((Allocator *)CONCAT44(extraout_var,iVar4),iVar28);
                  AllocatedData::AllocatedData
                            (&local_118,(Allocator *)CONCAT44(extraout_var,iVar4),pointer,iVar28);
                  ppuVar13 = local_180;
                  size = pSVar23->entry_size;
                  if (local_c8 == local_178) {
                    uVar16 = 0;
                  }
                  else {
                    lVar11 = 0;
                    dest = (int *)local_118.pointer;
                    do {
                      FastMemcpy(dest,ppuVar13[lVar11],size);
                      size = pSVar23->entry_size;
                      dest = (int *)((long)dest + size);
                      lVar11 = lVar11 + 1;
                      uVar16 = local_d0;
                    } while (uVar26 + (uVar26 == 0) != lVar11);
                  }
                  uVar26 = local_178;
                  switchD_012b9b0d::default
                            (local_138.free_function + size * local_178,local_118.pointer,
                             uVar16 * size);
                  if ((local_160 + 1 != uVar26) && (local_188 < local_158->column_count - 1)) {
                    lVar17 = local_158->entry_size * uVar26;
                    p_Var8 = local_138.free_function + local_158->comparison_size + lVar17;
                    lVar11 = local_c8 + ~uVar26;
                    lVar19 = ~uVar26 + local_c8;
                    lVar22 = 0;
                    l_ptr = local_138.allocate_function +
                            *pvVar9 + *(uint *)(local_138.free_function +
                                               local_158->comparison_size + lVar17) * local_140;
                    do {
                      iVar28 = local_158->entry_size;
                      r_ptr = local_138.allocate_function +
                              *pvVar9 + *(uint *)(p_Var8 + iVar28) * local_140;
                      iVar4 = Comparators::CompareVal((data_ptr_t)l_ptr,(data_ptr_t)r_ptr,&local_b0)
                      ;
                      p_Var8 = p_Var8 + iVar28;
                      *(bool *)(local_70 + lVar22) = iVar4 == 0;
                      lVar22 = lVar22 + 1;
                      l_ptr = r_ptr;
                    } while (lVar19 + (ulong)(lVar11 == 0) != lVar22);
                  }
                  AllocatedData::~AllocatedData(&local_118);
                  LogicalType::~LogicalType(&local_b0);
                  operator_delete__(local_180);
                  this = local_e0;
                  pSVar23 = local_158;
                  __s._M_head_impl = (PrivateAllocatorData *)local_138.private_data;
                  count = (idx_t *)local_138.reallocate_function;
                }
                iVar28 = *count;
                uVar26 = local_c0;
              }
              uVar26 = uVar26 + 1;
            } while (uVar26 < iVar28);
          }
          BufferHandle::~BufferHandle(&local_48);
          lVar11 = *count - 1;
          if (*count == 1) break;
          lVar19 = 0;
          bVar21 = 0;
          do {
            while ((bVar21 & 1) == 0) {
              bVar21 = *(byte *)((long)&(__s._M_head_impl)->_vptr_PrivateAllocatorData + lVar19);
              lVar19 = lVar19 + 1;
              if (lVar19 == lVar11) {
                if (bVar21 == 0) goto LAB_012b5790;
                goto LAB_012b5760;
              }
            }
            lVar19 = lVar19 + 1;
            bVar21 = 1;
          } while (lVar19 != lVar11);
        }
LAB_012b5760:
        local_150 = local_150 + local_170;
        local_170 = 0;
        pSVar23 = this->sort_layout;
        bVar29 = false;
      }
      local_188 = local_188 + 1;
    } while (local_188 < pSVar23->column_count);
LAB_012b5790:
    if (local_190._M_head_impl != (PrivateAllocatorData *)0x0) {
      operator_delete__(local_190._M_head_impl);
    }
  }
  BufferHandle::~BufferHandle(&local_60);
  return;
}

Assistant:

void LocalSortState::SortInMemory() {
	auto &sb = *sorted_blocks.back();
	auto &block = *sb.radix_sorting_data.back();
	const auto &count = block.count;
	auto handle = buffer_manager->Pin(block.block);
	const auto dataptr = handle.Ptr();
	// Assign an index to each row
	data_ptr_t idx_dataptr = dataptr + sort_layout->comparison_size;
	for (uint32_t i = 0; i < count; i++) {
		Store<uint32_t>(i, idx_dataptr);
		idx_dataptr += sort_layout->entry_size;
	}
	// Radix sort and break ties until no more ties, or until all columns are sorted
	idx_t sorting_size = 0;
	idx_t col_offset = 0;
	unsafe_unique_array<bool> ties_ptr;
	bool *ties = nullptr;
	bool contains_string = false;
	for (idx_t i = 0; i < sort_layout->column_count; i++) {
		sorting_size += sort_layout->column_sizes[i];
		contains_string = contains_string || sort_layout->logical_types[i].InternalType() == PhysicalType::VARCHAR;
		if (sort_layout->constant_size[i] && i < sort_layout->column_count - 1) {
			// Add columns to the sorting size until we reach a variable size column, or the last column
			continue;
		}

		if (!ties) {
			// This is the first sort
			RadixSort(*buffer_manager, dataptr, count, col_offset, sorting_size, *sort_layout, contains_string);
			ties_ptr = make_unsafe_uniq_array_uninitialized<bool>(count);
			ties = ties_ptr.get();
			std::fill_n(ties, count - 1, true);
			ties[count - 1] = false;
		} else {
			// For subsequent sorts, we only have to subsort the tied tuples
			SubSortTiedTuples(*buffer_manager, dataptr, count, col_offset, sorting_size, ties, *sort_layout,
			                  contains_string);
		}

		contains_string = false;

		if (sort_layout->constant_size[i] && i == sort_layout->column_count - 1) {
			// All columns are sorted, no ties to break because last column is constant size
			break;
		}

		ComputeTies(dataptr, count, col_offset, sorting_size, ties, *sort_layout);
		if (!AnyTies(ties, count)) {
			// No ties, stop sorting
			break;
		}

		if (!sort_layout->constant_size[i]) {
			SortTiedBlobs(*buffer_manager, sb, ties, dataptr, count, i, *sort_layout);
			if (!AnyTies(ties, count)) {
				// No more ties after tie-breaking, stop
				break;
			}
		}

		col_offset += sorting_size;
		sorting_size = 0;
	}
}